

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O0

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  IkReal x53;
  IkReal x52;
  IkReal x51;
  IkReal x50;
  IkReal x49;
  IkReal x48;
  IkReal x47;
  IkReal x46;
  IkReal x45;
  IkReal x44;
  IkReal x43;
  IkReal x42;
  IkReal x41;
  IkReal x40;
  IkReal x39;
  IkReal x38;
  IkReal x37;
  IkReal x36;
  IkReal x35;
  IkReal x34;
  IkReal x33;
  IkReal x32;
  IkReal x31;
  IkReal x30;
  IkReal x29;
  IkReal x28;
  IkReal x27;
  IkReal x26;
  IkReal x25;
  IkReal x24;
  IkReal x23;
  IkReal x22;
  IkReal x21;
  IkReal x20;
  IkReal x19;
  IkReal x18;
  IkReal x17;
  IkReal x16;
  IkReal x15;
  IkReal x14;
  IkReal x13;
  IkReal x12;
  IkReal x11;
  IkReal x10;
  IkReal x9;
  IkReal x8;
  IkReal x7;
  IkReal x6;
  IkReal x5;
  IkReal x4;
  IkReal x3;
  IkReal x2;
  IkReal x1;
  IkReal x0;
  IkReal *eerot_local;
  IkReal *eetrans_local;
  IkReal *j_local;
  
  dVar1 = IKcos(*j);
  dVar2 = IKcos(j[1]);
  dVar3 = IKsin(j[2]);
  dVar4 = IKcos(j[2]);
  dVar5 = IKsin(j[1]);
  dVar6 = IKsin(j[3]);
  dVar7 = IKcos(j[3]);
  dVar8 = IKsin(*j);
  dVar9 = IKsin(j[4]);
  dVar10 = IKcos(j[4]);
  dVar11 = IKsin(j[5]);
  dVar12 = IKcos(j[5]);
  dVar13 = dVar7 * 1.0;
  dVar14 = dVar8 * 1.0;
  dVar15 = dVar1 * 1.0;
  dVar16 = dVar1 * 0.08;
  dVar17 = dVar8 * 0.08;
  dVar18 = dVar4 * dVar5;
  dVar4 = dVar2 * dVar4;
  dVar19 = dVar3 * dVar5;
  dVar3 = dVar2 * dVar3;
  dVar20 = dVar19 - dVar4;
  dVar21 = dVar1 * dVar4 + dVar15 * -1.0 * dVar19;
  dVar22 = dVar4 * dVar8 - dVar14 * dVar19;
  dVar23 = dVar15 * (dVar3 * -1.0 - dVar18);
  dVar24 = dVar14 * (dVar3 * -1.0 - dVar18);
  dVar25 = dVar21 * dVar9;
  dVar26 = dVar23 * dVar6 + dVar7 * dVar8;
  dVar15 = dVar13 * -1.0 * dVar24 + dVar15 * -1.0 * dVar6;
  dVar27 = (dVar13 * -1.0 * dVar23 + dVar14 * dVar6) * dVar10;
  *eerot = dVar9 * (dVar23 * dVar7 - dVar14 * dVar6) + dVar21 * dVar10;
  eerot[1] = dVar12 * dVar26 + dVar11 * (dVar27 * -1.0 - dVar25);
  eerot[2] = dVar12 * (dVar25 + dVar27) + dVar11 * dVar26;
  *eetrans = dVar10 * (dVar16 * dVar4 + dVar16 * -1.0 * dVar19 * 1.0) +
             dVar1 * 0.365 * dVar4 +
             dVar9 * (dVar17 * -1.0 * dVar6 + dVar7 * 0.08 * dVar23) +
             dVar1 * 0.365 * -1.0 * dVar19 * 1.0 +
             dVar1 * 0.035 * dVar18 + dVar1 * 0.035 * dVar3 + dVar1 * 0.025 + dVar1 * dVar2 * 0.315;
  eerot[3] = dVar10 * (dVar14 * -1.0 * dVar4 + dVar14 * dVar19) + dVar15 * dVar9;
  eerot[4] = dVar11 * (dVar15 * dVar10 + dVar22 * dVar9) +
             dVar12 * (dVar1 * dVar13 - dVar24 * dVar6);
  eerot[5] = dVar11 * (dVar1 * dVar13 - dVar24 * dVar6) +
             dVar12 * (dVar9 * -1.0 * dVar22 +
                      dVar10 * -1.0 * (dVar1 * dVar6 * -1.0 - dVar24 * dVar7));
  dVar1 = dVar8 * 0.035 * 1.0;
  eetrans[1] = dVar3 * -1.0 * dVar1 +
               dVar18 * -1.0 * dVar1 +
               dVar8 * 0.365 * dVar19 +
               dVar8 * -0.025 +
               dVar2 * 0.315 * -1.0 * dVar8 +
               dVar9 * (dVar16 * -1.0 * dVar6 + dVar7 * 0.08 * -1.0 * dVar24) +
               dVar10 * (dVar17 * dVar19 + dVar17 * -1.0 * dVar4 * 1.0) +
               dVar8 * 0.365 * -1.0 * dVar4 * 1.0;
  eerot[6] = dVar7 * dVar9 * dVar20 + dVar10 * (dVar3 * -1.0 - dVar18);
  eerot[7] = dVar12 * dVar20 * dVar6 + dVar11 * ((dVar18 + dVar3) * dVar9 + dVar20 * dVar7 * dVar10)
  ;
  eerot[8] = dVar12 * (dVar9 * -1.0 * (dVar18 + dVar3) + dVar10 * -1.0 * dVar20 * dVar7) +
             dVar11 * dVar20 * dVar6;
  eetrans[2] = dVar5 * -0.315 +
               dVar4 * 0.035 +
               dVar7 * dVar9 * (dVar4 * -0.08 + dVar19 * 0.08) +
               dVar10 * (dVar3 * -0.08 + dVar18 * -0.08) +
               dVar19 * -0.035 + dVar3 * -0.365 + dVar18 * -0.365 + 0.4;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((1.0)*x6);
x13=((0.035)*x7);
x14=((0.365)*x7);
x15=((1.0)*x7);
x16=((0.035)*x0);
x17=((1.0)*x0);
x18=((0.315)*x1);
x19=((0.08)*x0);
x20=((0.365)*x0);
x21=((0.08)*x7);
x22=((0.08)*x6);
x23=(x3*x4);
x24=(x0*x5);
x25=(x1*x3);
x26=((-1.0)*x9);
x27=((-1.0)*x8);
x28=(x2*x4);
x29=(x1*x2);
x30=(x6*x8);
x31=(x15*x5);
x32=(x0*x12);
x33=(x15*x28);
x34=((((-1.0)*x25))+x28);
x35=(x23+x29);
x36=(x34*x5);
x37=(x34*x6);
x38=(((x0*x25))+(((-1.0)*x17*x28)));
x39=((((-1.0)*x33))+((x25*x7)));
x40=(x37*x9);
x41=(x17*(((((-1.0)*x23))+(((-1.0)*x29)))));
x42=(x15*(((((-1.0)*x23))+(((-1.0)*x29)))));
x43=(x38*x8);
x44=(x42*x5);
x45=(x42*x6);
x46=((-1.0)*x42);
x47=(((x41*x5))+((x6*x7)));
x48=((((-1.0)*x12*x41))+x31);
x49=((((-1.0)*x12*x42))+(((-1.0)*x17*x5)));
x50=(x48*x9);
eerot[0]=(((x8*(((((-1.0)*x31))+((x41*x6))))))+((x38*x9)));
eerot[1]=(((x11*x47))+((x10*(((((-1.0)*x43))+(((-1.0)*x50)))))));
eerot[2]=(((x11*((x43+x50))))+((x10*x47)));
IkReal x51=((1.0)*x28);
eetrans[0]=((((0.025)*x0))+((x0*x18))+((x16*x29))+((x16*x23))+(((-1.0)*x20*x51))+((x8*(((((-1.0)*x21*x5))+((x22*x41))))))+((x20*x25))+((x9*((((x19*x25))+(((-1.0)*x19*x51)))))));
eerot[3]=(((x9*(((((-1.0)*x15*x25))+x33))))+((x49*x8)));
eerot[4]=(((x10*((((x49*x9))+((x39*x8))))))+((x11*(((((-1.0)*x44))+x32)))));
eerot[5]=(((x10*(((((-1.0)*x44))+x32))))+((x11*((((x27*x39))+((x26*(((((-1.0)*x45))+(((-1.0)*x24)))))))))));
IkReal x52=((1.0)*x13);
IkReal x53=((1.0)*x25);
eetrans[1]=(((x9*((((x21*x28))+(((-1.0)*x21*x53))))))+(((-1.0)*x14*x53))+((x8*(((((-1.0)*x19*x5))+(((-1.0)*x22*x42))))))+(((-1.0)*x18*x7))+(((-0.025)*x7))+((x14*x28))+(((-1.0)*x23*x52))+(((-1.0)*x29*x52)));
eerot[6]=(((x30*x34))+((x9*(((((-1.0)*x23))+(((-1.0)*x29)))))));
eerot[7]=(((x11*x36))+((x10*((((x35*x8))+x40)))));
eerot[8]=(((x11*((((x27*x35))+((x26*x37))))))+((x10*x36)));
eetrans[2]=((0.4)+(((-0.365)*x23))+(((-0.365)*x29))+(((-0.035)*x28))+((x9*(((((-0.08)*x29))+(((-0.08)*x23))))))+((x30*(((((-0.08)*x25))+(((0.08)*x28))))))+(((0.035)*x25))+(((-0.315)*x4)));
}